

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tags.hpp
# Opt level: O1

VariableTag * __thiscall Qentem::Tags::TagBit::MakeVariableTag(TagBit *this)

{
  int *piVar1;
  VariableTag *pVVar2;
  long lVar3;
  ulong uVar4;
  
  pVVar2 = (VariableTag *)operator_new(8);
  if (MemoryRecord::AddAllocation(void*)::storage == '\0') {
    MakeVariableTag();
  }
  piVar1 = MemoryRecord::AddAllocation(void*)::storage;
  *MemoryRecord::AddAllocation(void*)::storage = *MemoryRecord::AddAllocation(void*)::storage + 1;
  piVar1[2] = piVar1[2] + 1;
  lVar3 = malloc_usable_size(pVVar2);
  piVar1 = MemoryRecord::AddAllocation(void*)::storage;
  uVar4 = lVar3 + *(long *)(MemoryRecord::AddAllocation(void*)::storage + 4);
  *(ulong *)(MemoryRecord::AddAllocation(void*)::storage + 4) = uVar4;
  if (*(ulong *)(piVar1 + 6) < uVar4) {
    *(ulong *)(piVar1 + 6) = uVar4;
  }
  pVVar2->Offset = 0;
  pVVar2->Length = 0;
  pVVar2->IDLength = '\0';
  pVVar2->Level = '\0';
  this->type_ = Variable;
  this->storage_ = pVVar2;
  return pVVar2;
}

Assistant:

VariableTag *MakeVariableTag() {
        VariableTag *tag = Memory::AllocateInit<VariableTag>();

        type_    = TagType::Variable;
        storage_ = tag;

        return tag;
    }